

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::ConvertToSampledImagePass::CheckUsesOfSamplerVariable
          (ConvertToSampledImagePass *this,Instruction *sampler_variable,
          Instruction *image_to_be_combined_with)

{
  bool bVar1;
  reference ppIVar2;
  Instruction *sampled_image_inst;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  sampled_image_users;
  Instruction *load;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  sampler_variable_loads;
  Instruction *image_to_be_combined_with_local;
  Instruction *sampler_variable_local;
  ConvertToSampledImagePass *this_local;
  
  if (image_to_be_combined_with == (Instruction *)0x0) {
    this_local._4_4_ = Failure;
  }
  else {
    sampler_variable_loads.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)image_to_be_combined_with;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2);
    FindUses(this,sampler_variable,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2,OpLoad);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
    load = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  *)&load);
      if (!bVar1) break;
      ppIVar2 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2);
      sampled_image_users.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar2;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range3);
      FindUses(this,(Instruction *)
                    sampled_image_users.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range3,OpSampledImage);
      __end3 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range3);
      sampled_image_inst =
           (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range3);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                    *)&sampled_image_inst);
        if (!bVar1) break;
        ppIVar2 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end3);
        bVar1 = DoesSampledImageReferenceImage
                          (this,*ppIVar2,
                           (Instruction *)
                           sampler_variable_loads.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          this_local._4_4_ = Failure;
          bVar1 = true;
          goto LAB_00901324;
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end3);
      }
      bVar1 = false;
LAB_00901324:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range3);
      if (bVar1) goto LAB_0090135a;
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    this_local._4_4_ = SuccessWithoutChange;
LAB_0090135a:
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2);
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status ConvertToSampledImagePass::CheckUsesOfSamplerVariable(
    const Instruction* sampler_variable,
    Instruction* image_to_be_combined_with) {
  if (image_to_be_combined_with == nullptr) return Status::Failure;

  std::vector<Instruction*> sampler_variable_loads;
  FindUses(sampler_variable, &sampler_variable_loads, spv::Op::OpLoad);
  for (auto* load : sampler_variable_loads) {
    std::vector<Instruction*> sampled_image_users;
    FindUses(load, &sampled_image_users, spv::Op::OpSampledImage);
    for (auto* sampled_image_inst : sampled_image_users) {
      if (!DoesSampledImageReferenceImage(sampled_image_inst,
                                          image_to_be_combined_with)) {
        return Status::Failure;
      }
    }
  }
  return Status::SuccessWithoutChange;
}